

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O0

void __thiscall
r_exec::AutoFocusController::dispatch
          (AutoFocusController *this,View *input,_Fact *abstract_input,BindingMap *bm,bool *injected
          ,TPXMap *map)

{
  bool bVar1;
  uint uVar2;
  pointer pvVar3;
  TPX *pTVar4;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_58
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_50
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_48
  ;
  _Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true> local_40
  ;
  const_iterator m;
  TPXMap *map_local;
  bool *injected_local;
  BindingMap *bm_local;
  _Fact *abstract_input_local;
  View *input_local;
  AutoFocusController *this_local;
  
  m.super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>.
  _M_cur = (_Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
            )(_Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
              )map;
  std::__detail::
  _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_40);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
       ::begin(m.
               super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
               ._M_cur);
  std::__detail::
  _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_48,
             (_Node_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
              *)&local_50);
  local_40._M_cur = local_48._M_cur;
  while( true ) {
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<core::P<r_exec::_Fact>,_core::P<r_exec::TPX>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>_>
         ::end(m.
               super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
               ._M_cur);
    bVar1 = std::__detail::operator!=(&local_40,&local_58);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
                           *)&local_40);
    pTVar4 = core::P<r_exec::TPX>::operator->(&pvVar3->second);
    uVar2 = (*(pTVar4->super__Object)._vptr__Object[2])(pTVar4,input,abstract_input,bm);
    if (((uVar2 & 1) != 0) && ((*injected & 1U) == 0)) {
      *injected = true;
      inject_input(this,input,abstract_input,bm);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_false,_true>
                  *)&local_40);
  }
  return;
}

Assistant:

inline void AutoFocusController::dispatch(View *input, _Fact *abstract_input, BindingMap *bm, bool &injected, TPXMap &map)
{
    TPXMap::const_iterator m;

    for (m = map.begin(); m != map.end(); ++m) {
        if (m->second->take_input(input, abstract_input, bm)) {
            if (!injected) {
                injected = true;
                inject_input(input, abstract_input, bm);
            }
        }
    }
}